

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

void Cmd_addslot(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *pcVar2;
  PClass *p;
  FString local_30;
  PClassWeapon *local_28;
  PClassWeapon *type;
  uint slot;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  type._4_4_ = key;
  _slot = who;
  who_local = (APlayerPawn *)argv;
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 == 3) {
    pcVar2 = FCommandLine::operator[]((FCommandLine *)who_local,1);
    type._0_4_ = atoi(pcVar2);
    if ((uint)type < 10) {
      pcVar2 = FCommandLine::operator[]((FCommandLine *)who_local,2);
      p = PClass::FindClass(pcVar2);
      local_28 = dyn_cast<PClassWeapon>((DObject *)p);
      if (local_28 == (PClassWeapon *)0x0) {
        pcVar2 = FCommandLine::operator[]((FCommandLine *)who_local,2);
        Printf("%s is not a weapon\n",pcVar2);
        return;
      }
      if ((ParsingKeyConf & 1U) != 0) {
        pcVar2 = FCommandLine::args((FCommandLine *)who_local);
        FString::FString(&local_30,pcVar2);
        TArray<FString,_FString>::Push(&KeyConfWeapons,&local_30);
        FString::~FString(&local_30);
        return;
      }
      if (PlayingKeyConf != (FWeaponSlots *)0x0) {
        FWeaponSlots::AddSlot(PlayingKeyConf,(uint)type,local_28,false);
        return;
      }
      Net_WriteByte('8');
      Net_WriteByte((BYTE)(uint)type);
      Net_WriteWeapon(local_28);
      return;
    }
  }
  Printf("Usage: addslot <slot> <weapon>\n");
  return;
}

Assistant:

CCMD (addslot)
{
	unsigned int slot;

	if (argv.argc() != 3 || (slot = atoi (argv[1])) >= NUM_WEAPON_SLOTS)
	{
		Printf ("Usage: addslot <slot> <weapon>\n");
		return;
	}

	PClassWeapon *type= dyn_cast<PClassWeapon>(PClass::FindClass(argv[2]));
	if (type == NULL)
	{
		Printf("%s is not a weapon\n", argv[2]);
		return;
	}

	if (ParsingKeyConf)
	{
		KeyConfWeapons.Push(argv.args());
	}
	else if (PlayingKeyConf != NULL)
	{
		PlayingKeyConf->AddSlot(int(slot), type, false);
	}
	else
	{
		Net_WriteByte(DEM_ADDSLOT);
		Net_WriteByte(slot);
		Net_WriteWeapon(type);
	}
}